

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void __thiscall
Json::OurCharReader::OurCharReader(OurCharReader *this,bool collectComments,OurFeatures *features)

{
  OurImpl *this_00;
  unique_ptr<Json::OurCharReader::OurImpl,_std::default_delete<Json::OurCharReader::OurImpl>_>
  local_30;
  unique_ptr<Json::CharReader::Impl,_std::default_delete<Json::CharReader::Impl>_> local_28;
  OurFeatures *local_20;
  OurFeatures *features_local;
  OurCharReader *pOStack_10;
  bool collectComments_local;
  OurCharReader *this_local;
  
  local_20 = features;
  features_local._7_1_ = collectComments;
  pOStack_10 = this;
  this_00 = (OurImpl *)operator_new(0x140);
  OurImpl::OurImpl(this_00,(bool)(features_local._7_1_ & 1),local_20);
  std::unique_ptr<Json::OurCharReader::OurImpl,std::default_delete<Json::OurCharReader::OurImpl>>::
  unique_ptr<std::default_delete<Json::OurCharReader::OurImpl>,void>
            ((unique_ptr<Json::OurCharReader::OurImpl,std::default_delete<Json::OurCharReader::OurImpl>>
              *)&local_30,this_00);
  std::unique_ptr<Json::CharReader::Impl,std::default_delete<Json::CharReader::Impl>>::
  unique_ptr<Json::OurCharReader::OurImpl,std::default_delete<Json::OurCharReader::OurImpl>,void>
            ((unique_ptr<Json::CharReader::Impl,std::default_delete<Json::CharReader::Impl>> *)
             &local_28,&local_30);
  CharReader::CharReader(&this->super_CharReader,&local_28);
  std::unique_ptr<Json::CharReader::Impl,_std::default_delete<Json::CharReader::Impl>_>::~unique_ptr
            (&local_28);
  std::unique_ptr<Json::OurCharReader::OurImpl,_std::default_delete<Json::OurCharReader::OurImpl>_>
  ::~unique_ptr(&local_30);
  (this->super_CharReader)._vptr_CharReader = (_func_int **)&PTR__OurCharReader_001b1b30;
  return;
}

Assistant:

OurCharReader(bool collectComments, OurFeatures const& features)
      : CharReader(
            std::unique_ptr<OurImpl>(new OurImpl(collectComments, features))) {}